

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LICMPass::ProcessLoop(LICMPass *this,Loop *loop,Function *f)

{
  Status SVar1;
  bool bVar2;
  Status SVar3;
  reference ppLVar4;
  BasicBlock *pBVar5;
  reference ppBVar6;
  BasicBlock *bb;
  size_t i;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> loop_bbs;
  Loop *nested_loop;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_30;
  iterator nl;
  Status status;
  Function *f_local;
  Loop *loop_local;
  LICMPass *this_local;
  
  nl._M_current._4_4_ = SuccessWithoutChange;
  local_30._M_current = (Loop **)Loop::begin(loop);
  while( true ) {
    nested_loop = (Loop *)Loop::end(loop);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                        *)&nested_loop);
    if (!bVar2 || nl._M_current._4_4_ == Failure) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              ::operator*(&local_30);
    SVar1 = nl._M_current._4_4_;
    loop_bbs.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppLVar4;
    SVar3 = ProcessLoop(this,(Loop *)loop_bbs.
                                     super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,f);
    nl._M_current._4_4_ = CombineStatus(SVar1,SVar3);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
    ::operator++(&local_30);
  }
  memset(&i,0,0x18);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)&i
            );
  SVar1 = nl._M_current._4_4_;
  pBVar5 = Loop::GetHeaderBlock(loop);
  SVar3 = AnalyseAndHoistFromBB
                    (this,loop,f,pBVar5,
                     (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)&i);
  nl._M_current._4_4_ = CombineStatus(SVar1,SVar3);
  for (bb = (BasicBlock *)0x0;
      pBVar5 = (BasicBlock *)
               std::
               vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
               size((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&i), SVar1 = nl._M_current._4_4_,
      bb < pBVar5 && nl._M_current._4_4_ != Failure; bb = (BasicBlock *)((long)&bb->function_ + 1))
  {
    ppBVar6 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::operator[]((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                            *)&i,(size_type)bb);
    SVar1 = nl._M_current._4_4_;
    SVar3 = AnalyseAndHoistFromBB
                      (this,loop,f,*ppBVar6,
                       (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&i);
    nl._M_current._4_4_ = CombineStatus(SVar1,SVar3);
  }
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::~vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)&i
            );
  return SVar1;
}

Assistant:

Pass::Status LICMPass::ProcessLoop(Loop* loop, Function* f) {
  Status status = Status::SuccessWithoutChange;

  // Process all nested loops first
  for (auto nl = loop->begin(); nl != loop->end() && status != Status::Failure;
       ++nl) {
    Loop* nested_loop = *nl;
    status = CombineStatus(status, ProcessLoop(nested_loop, f));
  }

  std::vector<BasicBlock*> loop_bbs{};
  status = CombineStatus(
      status,
      AnalyseAndHoistFromBB(loop, f, loop->GetHeaderBlock(), &loop_bbs));

  for (size_t i = 0; i < loop_bbs.size() && status != Status::Failure; ++i) {
    BasicBlock* bb = loop_bbs[i];
    // do not delete the element
    status =
        CombineStatus(status, AnalyseAndHoistFromBB(loop, f, bb, &loop_bbs));
  }

  return status;
}